

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O0

Gnuplot * __thiscall Gnuplot::set_xrange(Gnuplot *this,double iFrom,double iTo)

{
  ostream *poVar1;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream cmdstr;
  double iTo_local;
  double iFrom_local;
  Gnuplot *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"set xrange[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iFrom);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iTo);
  std::operator<<(poVar1,"]");
  std::__cxx11::ostringstream::str();
  cmd(this,local_1c8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return this;
}

Assistant:

Gnuplot& Gnuplot::set_xrange(const double iFrom, const double iTo) {
  std::ostringstream cmdstr;

  cmdstr << "set xrange[" << iFrom << ":" << iTo << "]";
  cmd(cmdstr.str());

  return *this;
}